

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::unary_op_reciprocal>(Mat *a,Option *opt)

{
  long lVar1;
  long lVar2;
  long *in_RDI;
  float fVar3;
  int i;
  int size;
  unary_op_reciprocal op;
  int local_44;
  unary_op_reciprocal local_39 [9];
  long *local_30;
  long local_20;
  long local_10;
  long *local_8;
  
  lVar1 = in_RDI[8];
  lVar2 = in_RDI[7];
  local_30 = in_RDI;
  for (local_44 = 0; local_44 < (int)lVar1 * (int)lVar2; local_44 = local_44 + 1) {
    local_10 = (long)local_44;
    local_8 = local_30;
    fVar3 = unary_op_reciprocal::operator()(local_39,(float *)(*local_30 + local_10 * 4));
    local_20 = (long)local_44;
    *(float *)(*local_30 + local_20 * 4) = fVar3;
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int size = static_cast<int>(a.total());

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < size; i++)
    {
        a[i] = op(a[i]);
    }

    return 0;
}